

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_submodule * lys_sub_parse_fd(lys_module *module,int fd,LYS_INFORMAT format,unres_schema *unres)

{
  int iVar1;
  lys_submodule *plVar2;
  size_t local_38;
  size_t length;
  char *addr;
  
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x4e5,
                  "struct lys_submodule *lys_sub_parse_fd(struct lys_module *, int, LYS_INFORMAT, struct unres_schema *)"
                 );
  }
  if (-1 < fd) {
    iVar1 = lyp_mmap(module->ctx,fd,(ulong)(format == LYS_IN_YANG),&local_38,(void **)&length);
    if (iVar1 == 0) {
      if (length == 0) {
        plVar2 = (lys_submodule *)0x0;
        ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Empty submodule schema file.");
      }
      else {
        if ((module->field_0x40 & 1) != 0) {
          module = (lys_module *)module->data;
        }
        if (format == LYS_IN_YANG) {
          plVar2 = yang_read_submodule(module,(char *)length,0,unres);
        }
        else {
          if (format != LYS_IN_YIN) {
            ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                   ,0x4fb);
            return (lys_submodule *)0x0;
          }
          plVar2 = yin_read_submodule(module,(char *)length,unres);
        }
        lyp_munmap((void *)length,local_38);
        if (plVar2 == (lys_submodule *)0x0) {
          plVar2 = (lys_submodule *)0x0;
        }
        else if (plVar2->filepath == (char *)0x0) {
          lys_parse_set_filename(module->ctx,&plVar2->filepath,fd);
        }
      }
    }
    else {
      plVar2 = (lys_submodule *)0x0;
      ly_log(module->ctx,LY_LLERR,LY_ESYS,"Mapping file descriptor into memory failed (%s()).",
             "lys_sub_parse_fd");
    }
    return plVar2;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                ,0x4e6,
                "struct lys_submodule *lys_sub_parse_fd(struct lys_module *, int, LYS_INFORMAT, struct unres_schema *)"
               );
}

Assistant:

struct lys_submodule *
lys_sub_parse_fd(struct lys_module *module, int fd, LYS_INFORMAT format, struct unres_schema *unres)
{
    struct lys_submodule *submodule;
    size_t length;
    char *addr;

    assert(module);
    assert(fd >= 0);

    if (lyp_mmap(module->ctx, fd, format == LYS_IN_YANG ? 1 : 0, &length, (void **)&addr)) {
        LOGERR(module->ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!addr) {
        LOGERR(module->ctx, LY_EINVAL, "Empty submodule schema file.");
        return NULL;
    }

    /* get the main module */
    module = lys_main_module(module);

    switch (format) {
    case LYS_IN_YIN:
        submodule = yin_read_submodule(module, addr, unres);
        break;
    case LYS_IN_YANG:
        submodule = yang_read_submodule(module, addr, 0, unres);
        break;
    default:
        LOGINT(module->ctx);
        return NULL;
    }

    lyp_munmap(addr, length);

    if (submodule && !submodule->filepath) {
        lys_parse_set_filename(module->ctx, (const char **)&submodule->filepath, fd);
    }

    return submodule;

}